

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSSBOLayoutCase.cpp
# Opt level: O2

string * __thiscall
deqp::gles31::bb::(anonymous_namespace)::getAPIName_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,BufferBlock *block,
          BufferVar *var,TypeComponentVector *accessPath)

{
  VarTypeComponent *pVVar1;
  undefined8 uVar2;
  ostream *poVar3;
  char *pcVar4;
  __normal_iterator<const_glu::VarTypeComponent_*,_std::vector<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>_>
  begin;
  VarType curType;
  ostringstream name;
  VarType local_1c0;
  ostream local_1a8;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
  if ((*(long *)(this + 0x28) != 0) && (*(long *)(this + 0x20) != 0)) {
    poVar3 = std::operator<<(&local_1a8,*(char **)this);
    std::operator<<(poVar3,".");
  }
  std::operator<<(&local_1a8,(block->m_blockName)._M_dataplus._M_p);
  for (begin._M_current = (VarTypeComponent *)(var->m_name)._M_dataplus._M_p;
      pVVar1 = (VarTypeComponent *)(var->m_name)._M_string_length, begin._M_current != pVVar1;
      begin._M_current = begin._M_current + 1) {
    if ((begin._M_current)->type == ARRAY_ELEMENT) {
      pcVar4 = "[0]";
      poVar3 = &local_1a8;
      if ((begin._M_current + 1 != pVVar1) &&
         (pcVar4 = "[0]", begin._M_current != (VarTypeComponent *)(var->m_name)._M_dataplus._M_p)) {
        poVar3 = std::operator<<(&local_1a8,"[");
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,(begin._M_current)->index);
        pcVar4 = "]";
      }
      std::operator<<(poVar3,pcVar4);
    }
    else if ((begin._M_current)->type == STRUCT_MEMBER) {
      glu::
      getVarType<__gnu_cxx::__normal_iterator<glu::VarTypeComponent_const*,std::vector<glu::VarTypeComponent,std::allocator<glu::VarTypeComponent>>>>
                (&local_1c0,(glu *)&block->m_instanceName,(VarType *)(var->m_name)._M_dataplus._M_p,
                 begin,(__normal_iterator<const_glu::VarTypeComponent_*,_std::vector<glu::VarTypeComponent,_std::allocator<glu::VarTypeComponent>_>_>
                        )accessPath);
      uVar2 = local_1c0.m_data.basic;
      poVar3 = std::operator<<(&local_1a8,".");
      std::operator<<(poVar3,(((StructType *)uVar2)->m_members).
                             super__Vector_base<glu::StructMember,_std::allocator<glu::StructMember>_>
                             ._M_impl.super__Vector_impl_data._M_start[(begin._M_current)->index].
                             m_name._M_dataplus._M_p);
      glu::VarType::~VarType(&local_1c0);
    }
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
  return __return_storage_ptr__;
}

Assistant:

string getAPIName (const BufferBlock& block, const BufferVar& var, const glu::TypeComponentVector& accessPath)
{
	std::ostringstream name;

	if (block.getInstanceName())
		name << block.getBlockName() << ".";

	name << var.getName();

	for (glu::TypeComponentVector::const_iterator pathComp = accessPath.begin(); pathComp != accessPath.end(); pathComp++)
	{
		if (pathComp->type == glu::VarTypeComponent::STRUCT_MEMBER)
		{
			const VarType		curType		= glu::getVarType(var.getType(), accessPath.begin(), pathComp);
			const StructType*	structPtr	= curType.getStructPtr();

			name << "." << structPtr->getMember(pathComp->index).getName();
		}
		else if (pathComp->type == glu::VarTypeComponent::ARRAY_ELEMENT)
		{
			if (pathComp == accessPath.begin() || (pathComp+1) == accessPath.end())
				name << "[0]"; // Top- / bottom-level array
			else
				name << "[" << pathComp->index << "]";
		}
		else
			DE_ASSERT(false);
	}

	return name.str();
}